

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_split
          (HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,SpatialSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  undefined1 auVar1 [16];
  PrimRef *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  long lVar11;
  PrimRef *ref;
  PrimRef *ref_00;
  unsigned_long uVar12;
  pair<unsigned_long,_unsigned_long> pVar13;
  anon_class_1_0_00000001 local_131;
  long local_130;
  unsigned_long local_128;
  PrimInfoExtRange *local_120;
  unsigned_long local_118;
  PrimInfoExtRange *local_110;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  unsigned_long uStack_c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  unsigned_long uStack_70;
  vbool4 vSplitMask;
  vint4 vSplitPos;
  anon_class_24_3_36a9e8c5 local_48;
  
  local_128 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  local_118 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_108.m128[0] = INFINITY;
  local_108.m128[1] = INFINITY;
  local_108.m128[2] = INFINITY;
  local_108.m128[3] = INFINITY;
  local_f8 = 0xff800000;
  uStack_f4 = 0xff800000;
  uStack_f0 = 0xff800000;
  uStack_ec = 0xff800000;
  local_e8 = 0x7f800000;
  uStack_e4 = 0x7f800000;
  uStack_e0 = 0x7f800000;
  uStack_dc = 0x7f800000;
  local_d8 = 0xff800000;
  uStack_d4 = 0xff800000;
  uStack_d0 = 0xff800000;
  uStack_cc = 0xff800000;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8.m128[0] = INFINITY;
  local_b8.m128[1] = INFINITY;
  local_b8.m128[2] = INFINITY;
  local_b8.m128[3] = INFINITY;
  local_a8 = 0xff800000;
  uStack_a4 = 0xff800000;
  uStack_a0 = 0xff800000;
  uStack_9c = 0xff800000;
  local_98 = 0x7f800000;
  uStack_94 = 0x7f800000;
  uStack_90 = 0x7f800000;
  uStack_8c = 0x7f800000;
  local_88 = 0xff800000;
  uStack_84 = 0xff800000;
  uStack_80 = 0xff800000;
  uStack_7c = 0xff800000;
  local_78 = 0;
  uStack_70 = 0;
  auVar1._0_4_ = split->pos;
  auVar1._4_4_ = split->left;
  auVar1._8_4_ = split->right;
  auVar1._12_4_ = split->factor;
  vSplitPos.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vpermilps_avx(auVar1,0);
  local_48.mapping = &split->mapping;
  local_48.vSplitPos = &vSplitPos;
  lVar11 = (long)(1 << ((byte)split->dim & 0x1f)) * 0x10;
  vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar11);
  vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar11 + 8);
  local_48.vSplitMask = &vSplitMask;
  pPVar2 = this->prims0;
  ref_00 = pPVar2 + local_128;
  ref = pPVar2 + local_118;
  local_130 = -(long)pPVar2;
  local_120 = lset;
  local_110 = rset;
  do {
    ref = ref + -1;
    lVar11 = (long)&(ref_00->lower).field_0 + local_130;
    for (; ref_00 <= ref; ref_00 = ref_00 + 1) {
      bVar10 = sequential_spatial_split::anon_class_24_3_36a9e8c5::operator()(&local_48,ref_00);
      if (!bVar10) break;
      sequential_spatial_split::anon_class_1_0_00000001::operator()
                (&local_131,(PrimInfo *)&local_108.field_1,ref_00);
      lVar11 = lVar11 + 0x20;
    }
    while( true ) {
      if (ref < ref_00) {
        uVar12 = lVar11 >> 5;
        *(ulong *)&(local_120->super_CentGeomBBox3fa).geomBounds.lower.field_0 =
             CONCAT44(local_108.m128[1],local_108.m128[0]);
        *(ulong *)((long)&(local_120->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             CONCAT44(local_108.m128[3],local_108.m128[2]);
        *(ulong *)&(local_120->super_CentGeomBBox3fa).geomBounds.upper.field_0 =
             CONCAT44(uStack_f4,local_f8);
        *(ulong *)((long)&(local_120->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             CONCAT44(uStack_ec,uStack_f0);
        *(ulong *)&(local_120->super_CentGeomBBox3fa).centBounds.lower.field_0 =
             CONCAT44(uStack_e4,local_e8);
        *(ulong *)((long)&(local_120->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             CONCAT44(uStack_dc,uStack_e0);
        *(ulong *)&(local_120->super_CentGeomBBox3fa).centBounds.upper.field_0 =
             CONCAT44(uStack_d4,local_d8);
        *(ulong *)((long)&(local_120->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             CONCAT44(uStack_cc,uStack_d0);
        (local_120->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin =
             local_128;
        (local_120->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar12;
        (local_120->super_extended_range<unsigned_long>)._ext_end = uVar12;
        *(ulong *)&(local_110->super_CentGeomBBox3fa).geomBounds.lower.field_0 =
             CONCAT44(local_b8.m128[1],local_b8.m128[0]);
        *(ulong *)((long)&(local_110->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             CONCAT44(local_b8.m128[3],local_b8.m128[2]);
        *(ulong *)&(local_110->super_CentGeomBBox3fa).geomBounds.upper.field_0 =
             CONCAT44(uStack_a4,local_a8);
        *(ulong *)((long)&(local_110->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             CONCAT44(uStack_9c,uStack_a0);
        *(ulong *)&(local_110->super_CentGeomBBox3fa).centBounds.lower.field_0 =
             CONCAT44(uStack_94,local_98);
        *(ulong *)((long)&(local_110->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             CONCAT44(uStack_8c,uStack_90);
        *(ulong *)&(local_110->super_CentGeomBBox3fa).centBounds.upper.field_0 =
             CONCAT44(uStack_84,local_88);
        *(ulong *)((long)&(local_110->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             CONCAT44(uStack_7c,uStack_80);
        (local_110->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar12;
        (local_110->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = local_118
        ;
        (local_110->super_extended_range<unsigned_long>)._ext_end = local_118;
        pVar13.second = uStack_70;
        pVar13.first = uStack_c0;
        return pVar13;
      }
      bVar10 = sequential_spatial_split::anon_class_24_3_36a9e8c5::operator()(&local_48,ref);
      if (bVar10) break;
      sequential_spatial_split::anon_class_1_0_00000001::operator()
                (&local_131,(PrimInfo *)&local_b8.field_1,ref);
      ref = ref + -1;
    }
    sequential_spatial_split::anon_class_1_0_00000001::operator()
              (&local_131,(PrimInfo *)&local_108.field_1,ref);
    sequential_spatial_split::anon_class_1_0_00000001::operator()
              (&local_131,(PrimInfo *)&local_b8.field_1,ref_00);
    uVar6 = *(undefined8 *)&(ref_00->lower).field_0;
    uVar7 = *(undefined8 *)((long)&(ref_00->lower).field_0 + 8);
    uVar8 = *(undefined8 *)&(ref_00->upper).field_0;
    uVar9 = *(undefined8 *)((long)&(ref_00->upper).field_0 + 8);
    uVar3 = *(undefined8 *)((long)&(ref->lower).field_0 + 8);
    uVar4 = *(undefined8 *)&(ref->upper).field_0;
    uVar5 = *(undefined8 *)((long)&(ref->upper).field_0 + 8);
    *(undefined8 *)&(ref_00->lower).field_0 = *(undefined8 *)&(ref->lower).field_0;
    *(undefined8 *)((long)&(ref_00->lower).field_0 + 8) = uVar3;
    *(undefined8 *)&(ref_00->upper).field_0 = uVar4;
    *(undefined8 *)((long)&(ref_00->upper).field_0 + 8) = uVar5;
    *(undefined8 *)&(ref->lower).field_0 = uVar6;
    *(undefined8 *)((long)&(ref->lower).field_0 + 8) = uVar7;
    *(undefined8 *)&(ref->upper).field_0 = uVar8;
    *(undefined8 *)((long)&(ref->upper).field_0 + 8) = uVar9;
    ref_00 = ref_00 + 1;
  } while( true );
}

Assistant:

__noinline std::pair<size_t,size_t> sequential_spatial_split(const SpatialSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          /* init spatial mapping */
          const SpatialBinMapping<SPATIAL_BINS> &mapping = split.mapping;
          const vint4 vSplitPos(splitPos);
          const vbool4 vSplitMask( (int)splitDimMask );

          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) {
                                                const Vec3fa c = ref.bounds().center();
                                                return any(((vint4)mapping.bin(c) < vSplitPos) & vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });

          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;
          
          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);
          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }